

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::LayoutBindingBaseCase::initDefaultCSContext_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  bool bVar1;
  int iVar2;
  mapped_type *ppcVar3;
  mapped_type *this_00;
  char *pcVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *pmVar6;
  key_type kStack_1f8;
  allocator<char> local_1d1;
  key_type local_1d0;
  key_type local_1ac;
  StringStream s;
  
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_
       = 2;
  ppcVar3 = std::
            map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
            ::operator[](&this->m_templates,(key_type *)&s);
  *ppcVar3 = 
  "${VERSION}${UNIFORM_DECL}\n${OPTIONAL_FUNCTION_BLOCK}\nvoid main(void)\n{\n  ${OUT_VAR_TYPE} tmp = ${UNIFORM_ACCESS}\n  ${OUT_ASSIGNMENT} tmp ${OUT_END}\n}\n"
  ;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_
       = 2;
  this_00 = std::
            map<glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::operator[](&this->m_templateParams,(key_type *)&s);
  StringStream::StringStream(&s);
  pcVar4 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  poVar5 = std::operator<<((ostream *)&s,pcVar4);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)&s,"layout (local_size_x = 1) in;\nprecision highp float;\n");
  bVar1 = needsPrecision(this);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&s,"precision highp ");
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    poVar5 = std::operator<<(poVar5,*(char **)(CONCAT44(extraout_var,iVar2) + 0x18));
    std::operator<<(poVar5,";\n");
  }
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  if (*(int *)(CONCAT44(extraout_var_00,iVar2) + 8) == 2) {
    poVar5 = std::operator<<((ostream *)&s,"layout(binding=0, std430) buffer outData {\n    ");
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    poVar5 = std::operator<<(poVar5,*(char **)(CONCAT44(extraout_var_01,iVar2) + 0x10));
    std::operator<<(poVar5," outColor;\n};\n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_1f8,"OUT_ASSIGNMENT",(allocator<char> *)&local_1d0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&kStack_1f8);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&kStack_1f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_1f8,"OUT_END",(allocator<char> *)&local_1d0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&kStack_1f8);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  else {
    std::operator<<((ostream *)&s,
                    "layout(binding=0, rgba8) uniform highp writeonly image2D outImage;\n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_1f8,"OUT_ASSIGNMENT",(allocator<char> *)&local_1d0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&kStack_1f8);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&kStack_1f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_1f8,"OUT_END",(allocator<char> *)&local_1d0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&kStack_1f8);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  std::__cxx11::string::~string((string *)&kStack_1f8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"VERSION",(allocator<char> *)&local_1ac);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&kStack_1f8);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&kStack_1f8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_1f8,"OUT_VAR_TYPE",(allocator<char> *)&local_1d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&kStack_1f8);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&kStack_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_1f8,"UNIFORM_ACCESS",(allocator<char> *)&local_1d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&kStack_1f8);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&kStack_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_1f8,"UNIFORM_DECL",(allocator<char> *)&local_1d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&kStack_1f8);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&kStack_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_1f8,"OPTIONAL_FUNCTION_BLOCK",(allocator<char> *)&local_1d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&kStack_1f8);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&kStack_1f8);
  local_1ac = ComputeShader;
  ppcVar3 = std::
            map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
            ::operator[](&this->m_templates,&local_1ac);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,*ppcVar3,&local_1d1);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&kStack_1f8,&local_1d0);
  tcu::StringTemplate::specialize(__return_storage_ptr__,(StringTemplate *)&kStack_1f8,this_00);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&kStack_1f8);
  std::__cxx11::string::~string((string *)&local_1d0);
  StringStream::~StringStream(&s);
  return __return_storage_ptr__;
}

Assistant:

String initDefaultCSContext()
	{
		// build compute shader
		m_templates[ComputeShader] = "${VERSION}"
									 "${UNIFORM_DECL}\n"
									 "${OPTIONAL_FUNCTION_BLOCK}\n"
									 "void main(void)\n"
									 "{\n"
									 "  ${OUT_VAR_TYPE} tmp = ${UNIFORM_ACCESS}\n"
									 "  ${OUT_ASSIGNMENT} tmp ${OUT_END}\n"
									 "}\n";

		StringMap& args = m_templateParams[ComputeShader];
		// images don't have default precision qualifier
		StringStream s;
		s << glu::getGLSLVersionDeclaration(m_glslVersion) << "\n";
		s << "layout (local_size_x = 1) in;\n"
			 "precision highp float;\n";
		if (needsPrecision())
		{
			s << "precision highp " << getTestParameters().uniform_type << ";\n";
		}

		// bindings are per uniform type...
		if (getTestParameters().surface_type == Image)
		{
			s << "layout(binding=0, std430) buffer outData {\n"
				 "    "
			  << getTestParameters().vector_type << " outColor;\n"
													"};\n";
			args["OUT_ASSIGNMENT"] = "outColor =";
			args["OUT_END"]		   = ";";
		}
		else
		{
			s << "layout(binding=0, rgba8) uniform highp writeonly image2D outImage;\n";
			args["OUT_ASSIGNMENT"] = "imageStore(outImage, ivec2(0), ";
			args["OUT_END"]		   = ");";
		}
		args["VERSION"]					= s.str();
		args["OUT_VAR_TYPE"]			= getTestParameters().vector_type;
		args["UNIFORM_ACCESS"]			= "vec4(0.0,0.0,0.0,0.0);";
		args["UNIFORM_DECL"]			= "";
		args["OPTIONAL_FUNCTION_BLOCK"] = "";

		return tcu::StringTemplate(m_templates[ComputeShader]).specialize(args);
	}